

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

float ScaleMaxSamples_C(float *src,float *dst,float scale,int width)

{
  float fVar1;
  float local_2c;
  float vs;
  float v;
  int i;
  float fmax;
  int width_local;
  float scale_local;
  float *dst_local;
  float *src_local;
  
  fmax = 0.0;
  dst_local = dst;
  src_local = src;
  for (i = 0; i < width; i = i + 1) {
    local_2c = *src_local;
    fVar1 = local_2c * scale;
    if (local_2c <= fmax) {
      local_2c = fmax;
    }
    fmax = local_2c;
    *dst_local = fVar1;
    dst_local = dst_local + 1;
    src_local = src_local + 1;
  }
  return fmax;
}

Assistant:

float ScaleMaxSamples_C(const float* src, float* dst, float scale, int width) {
  float fmax = 0.f;
  int i;
  for (i = 0; i < width; ++i) {
    float v = *src++;
    float vs = v * scale;
    fmax = (v > fmax) ? v : fmax;
    *dst++ = vs;
  }
  return fmax;
}